

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execCas<(moira::Core)2,(moira::Instr)143,(moira::Mode)5,2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  u32 uVar3;
  uint uVar4;
  u32 uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  uVar8 = (ulong)(uVar1 & 7);
  uVar5 = (this->reg).pc + 2;
  (this->reg).pc = uVar5;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar5);
  (this->queue).irc = (u16)uVar5;
  uVar5 = computeEA<(moira::Core)2,(moira::Mode)5,2,128ull>(this,opcode & 7);
  uVar3 = read<(moira::Core)2,(moira::AddrSpace)1,2,128ull>(this,uVar5);
  uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar8 * 4);
  uVar4 = uVar2 & 0xffff;
  uVar7 = (ulong)uVar3 - (ulong)uVar4;
  (this->reg).sr.c = (bool)((byte)(uVar7 >> 0x10) & 1);
  (this->reg).sr.v = (bool)((byte)((((uint)uVar7 ^ uVar3) & (uVar4 ^ uVar3)) >> 0xf) & 1);
  bVar9 = (short)uVar7 == 0;
  (this->reg).sr.z = bVar9;
  (this->reg).sr.n = (bool)((byte)(uVar7 >> 0xf) & 1);
  if (bVar9) {
    write<(moira::Core)2,(moira::AddrSpace)1,2,0ull>
              (this,uVar5,(uint)*(ushort *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 4 & 0x1c))
              );
    iVar6 = 0x14;
  }
  else {
    *(uint *)((long)&(this->reg).field_3 + uVar8 * 4) = uVar2 & 0xffff0000 | uVar3;
    iVar6 = 0x11;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar6 + this->cp));
  uVar5 = (this->reg).pc;
  (this->reg).pc0 = uVar5;
  (this->queue).ird = (this->queue).irc;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar5 + 2);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  return;
}

Assistant:

void
Moira::execCas(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    int dst = _____________xxx(opcode);
    int dc  = _____________xxx(queue.irc);
    int du  = _______xxx______(queue.irc);

    u32 ea, data;

    readExt<C>();
    readOp<C, M, S, STD_AE_FRAME>(dst, &ea, &data);

    auto compare = readD(dc);

    // Set flags
    cmp<C, S>(CLIP<S>(compare), data);

    if (!reg.sr.z) {

        writeD(dc, CLEAR<S>(compare) | data);

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PD   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_DI   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_IX   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AW   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_AL   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)

    } else {

        writeM<C, M, S>(ea, readD<S>(du));

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PD   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_DI   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_IX   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AW   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AL   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
    }

    prefetch<C, POLL>();

    FINALIZE
}